

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midl.c
# Opt level: O0

int mdb_midl_need(MDB_IDL *idp,uint num)

{
  MDB_IDL pMVar1;
  uint uVar2;
  ulong *puVar3;
  MDB_IDL ids;
  uint num_local;
  MDB_IDL *idp_local;
  
  pMVar1 = *idp;
  uVar2 = num + (int)*pMVar1;
  if (pMVar1[-1] < (ulong)uVar2) {
    uVar2 = uVar2 + (uVar2 >> 2) + 0x102 & 0xffffff00;
    puVar3 = (ulong *)realloc(pMVar1 + -1,(ulong)uVar2 << 3);
    if (puVar3 == (ulong *)0x0) {
      return 0xc;
    }
    *puVar3 = (ulong)(uVar2 - 2);
    *idp = puVar3 + 1;
  }
  return 0;
}

Assistant:

int mdb_midl_need( MDB_IDL *idp, unsigned num )
{
	MDB_IDL ids = *idp;
	num += ids[0];
	if (num > ids[-1]) {
		num = (num + num/4 + (256 + 2)) & -256;
		if (!(ids = realloc(ids-1, num * sizeof(MDB_ID))))
			return ENOMEM;
		*ids++ = num - 2;
		*idp = ids;
	}
	return 0;
}